

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_sifm.cc
# Opt level: O3

bool __thiscall
hwtest::pgraph::anon_unknown_14::MthdSurfDvdFormat::is_valid_val(MthdSurfDvdFormat *this)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = (this->super_SingleMthdTest).super_MthdTest.val;
  if (uVar1 - 0x30000 < 0xfffe0000) {
    return false;
  }
  uVar2 = 0xe01f;
  if ((this->super_SingleMthdTest).super_MthdTest.cls == 0x88) {
    uVar2 = 0x3f;
  }
  return (short)uVar1 != 0 && (uVar2 & uVar1) == 0;
}

Assistant:

bool is_valid_val() override {
		int sfmt = extr(val, 16, 16);
		if (sfmt == 0 || sfmt > 2)
			return false;
		if (val & (cls == 0x88 ? 0x3f : 0xe01f) || !(val & 0xffff))
			return false;
		return true;
	}